

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawCircleLines(int centerX,int centerY,float radius,Color color)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  rlCheckRenderBatchLimit(0x48);
  rlBegin(1);
  rlColor4ub(color.r,color.g,color.b,color.a);
  uVar1 = 0;
  while (uVar1 < 0x168) {
    fVar2 = sinf((float)(int)uVar1 * 0.017453292);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar2 * radius + (float)centerX,fVar3 * radius + (float)centerY);
    uVar1 = uVar1 + 10;
    fVar2 = sinf((float)(int)uVar1 * 0.017453292);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar2 * radius + (float)centerX,fVar3 * radius + (float)centerY);
  }
  rlEnd();
  return;
}

Assistant:

void DrawCircleLines(int centerX, int centerY, float radius, Color color)
{
    rlCheckRenderBatchLimit(2*36);

    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);

        // NOTE: Circle outline is drawn pixel by pixel every degree (0 to 360)
        for (int i = 0; i < 360; i += 10)
        {
            rlVertex2f(centerX + sinf(DEG2RAD*i)*radius, centerY + cosf(DEG2RAD*i)*radius);
            rlVertex2f(centerX + sinf(DEG2RAD*(i + 10))*radius, centerY + cosf(DEG2RAD*(i + 10))*radius);
        }
    rlEnd();
}